

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O2

void * MPIU_Scatter(MPI_Comm comm,int root,void *sendbuffer,void *recvbuffer,int nrecv,size_t elsize
                   ,int *totalnsend)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  long lVar11;
  long lVar12;
  ulong auStack_a0 [4];
  undefined8 uStack_80;
  int iStack_7c;
  undefined8 local_78;
  MPI_Datatype dtype;
  void *local_68;
  void *local_60;
  undefined1 *local_58;
  size_t local_50;
  undefined8 local_48;
  int local_3c;
  uint local_38;
  int ThisTask;
  int NTask;
  int nrecv_local;
  
  local_48 = CONCAT44(in_register_00000034,root);
  uStack_80 = 0x1055ef;
  local_68 = recvbuffer;
  local_60 = sendbuffer;
  ThisTask = nrecv;
  MPI_Comm_size();
  uStack_80 = 0x1055fb;
  MPI_Comm_rank(comm,&local_3c);
  uStack_80 = 0x105614;
  local_50 = elsize;
  MPI_Type_contiguous(elsize & 0xffffffff,&ompi_mpi_byte,&local_78);
  uStack_80 = 0x10561c;
  MPI_Type_commit(&local_78);
  local_58 = (undefined1 *)&local_78;
  lVar2 = -((ulong)local_38 * 4 + 0xf & 0xfffffffffffffff0);
  lVar12 = (long)&local_78 + lVar2;
  uVar10 = (ulong)(local_38 + 1) * 4 + 0xf & 0xfffffffffffffff0;
  lVar11 = lVar12 - uVar10;
  *(undefined8 *)(lVar11 + -8) = 1;
  uVar1 = *(ulong *)(lVar11 + -8);
  dtype = (MPI_Datatype)comm;
  *(MPI_Comm *)(lVar11 + -8) = comm;
  *(undefined8 *)(lVar11 + -0x10) = local_48;
  *(undefined8 *)(lVar11 + -0x18) = 0x10567d;
  MPI_Gather(&ThisTask,uVar1,&ompi_mpi_int,lVar12,uVar1 & 0xffffffff,&ompi_mpi_int);
  *(undefined4 *)(lVar12 - uVar10) = 0;
  lVar6 = (long)(int)local_38;
  *(undefined8 *)(lVar11 + -8) = 1;
  iVar9 = 0;
  for (lVar8 = *(long *)(lVar11 + -8); lVar8 <= lVar6; lVar8 = lVar8 + 1) {
    iVar9 = iVar9 + *(int *)((long)&iStack_7c + lVar8 * 4 + lVar2);
    *(int *)(lVar11 + lVar8 * 4) = iVar9;
  }
  pvVar7 = local_68;
  if (local_68 == (void *)0x0) {
    lVar8 = (long)ThisTask * local_50;
    *(undefined8 *)(lVar11 + -8) = 0x1056d5;
    pvVar7 = (void *)(*(code *)_MPIUMem_0)
                               ("recvbuffer",lVar8,
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/mp-mpiu.c"
                                ,0x14f,_MPIUMem_2);
  }
  iVar9 = ThisTask;
  uVar4 = local_48;
  pvVar3 = local_60;
  if (local_3c == (int)local_48) {
    if (totalnsend == (int *)0x0) goto LAB_00105702;
    iVar5 = *(int *)(lVar11 + (long)(int)local_38 * 4);
  }
  else {
    iVar5 = 0;
    if (totalnsend == (int *)0x0) goto LAB_00105702;
  }
  *totalnsend = iVar5;
LAB_00105702:
  *(MPI_Datatype *)(lVar11 + -0x10) = dtype;
  *(undefined8 *)(lVar11 + -0x18) = uVar4;
  *(undefined8 *)(lVar11 + -0x20) = local_78;
  *(undefined8 *)(lVar11 + -0x28) = 0x105729;
  MPI_Scatterv(pvVar3,lVar12,lVar11,local_78,pvVar7,iVar9);
  *(undefined8 *)(lVar11 + -8) = 0x105735;
  MPI_Type_free(&local_78);
  return pvVar7;
}

Assistant:

void *
MPIU_Scatter (MPI_Comm comm, int root, const void * sendbuffer, void * recvbuffer, int nrecv, size_t elsize, int * totalnsend)
{
    int NTask;
    int ThisTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    MPI_Datatype dtype;
    MPI_Type_contiguous(elsize, MPI_BYTE, &dtype);
    MPI_Type_commit(&dtype);

    int sendcount[NTask];
    int sdispls[NTask + 1];
    int i;

    MPI_Gather(&nrecv, 1, MPI_INT, sendcount, 1, MPI_INT, root, comm);

    sdispls[0] = 0;
    for(i = 1; i <= NTask; i ++) {
        sdispls[i] = sdispls[i - 1] + sendcount[i - 1];
    }

    if(recvbuffer == NULL)
        recvbuffer = MPIU_Malloc("recvbuffer", elsize, nrecv);

    if(ThisTask == root) {
        if(totalnsend)
            *totalnsend = sdispls[NTask];
    } else {
        if(totalnsend)
            *totalnsend = 0;
    }
    MPI_Scatterv(sendbuffer, sendcount, sdispls, dtype, recvbuffer, nrecv, dtype, root, comm);

    MPI_Type_free(&dtype);

    return recvbuffer;
}